

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wave.c
# Opt level: O3

void calc_grid(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  dVar12 = dt;
  lVar5 = 0;
  uVar6 = 0;
  do {
    uVar6 = uVar6 + 1;
    uVar8 = uVar6 & 0xffffffff;
    if (uVar6 == 0x32) {
      uVar8 = 0;
    }
    lVar9 = 0;
    do {
      lVar11 = lVar5 + lVar9;
      dVar13 = *(double *)((long)p[0] + lVar11 + 8);
      dVar14 = *(double *)((long)p[uVar8] + lVar9 + 8);
      *(double *)((long)ax[0] + lVar11) =
           *(double *)((long)p[0] + lVar11) - *(double *)((long)p[uVar8] + lVar9);
      *(double *)((long)ax[0] + lVar11 + 8) = dVar13 - dVar14;
      lVar9 = lVar9 + 0x10;
    } while (lVar9 != 400);
    lVar5 = lVar5 + 400;
  } while (uVar6 != 0x32);
  lVar5 = 0;
  uVar6 = 0;
  do {
    uVar6 = uVar6 + 1;
    uVar8 = uVar6 & 0xffffffff;
    if (uVar6 == 0x32) {
      uVar8 = 0;
    }
    lVar9 = 0;
    do {
      *(double *)((long)ay[0] + lVar5 + lVar9) =
           *(double *)((long)p[0] + lVar5 + lVar9) - *(double *)((long)p[0] + uVar8 * 8 + lVar9);
      lVar9 = lVar9 + 400;
    } while (lVar9 != 20000);
    lVar5 = lVar5 + 8;
  } while (uVar6 != 0x32);
  dVar12 = dVar12 * 10.0;
  lVar5 = 0;
  lVar9 = 0;
  do {
    lVar11 = 0;
    do {
      lVar7 = lVar5 + lVar11;
      dVar2 = *(double *)((long)ax[0] + lVar7 + 8);
      dVar14 = *(double *)((long)vx[0] + lVar7 + 8);
      dVar3 = *(double *)((long)ay[0] + lVar7);
      dVar4 = *(double *)((long)ay[0] + lVar7 + 8);
      dVar13 = *(double *)((long)vy[0] + lVar7);
      dVar1 = *(double *)((long)vy[0] + lVar7 + 8);
      *(double *)((long)vx[0] + lVar7) =
           *(double *)((long)ax[0] + lVar7) * dVar12 + *(double *)((long)vx[0] + lVar7);
      *(double *)((long)vx[0] + lVar7 + 8) = dVar2 * dVar12 + dVar14;
      *(double *)((long)vy[0] + lVar7) = dVar3 * dVar12 + dVar13;
      *(double *)((long)vy[0] + lVar7 + 8) = dVar4 * dVar12 + dVar1;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 400);
    lVar9 = lVar9 + 1;
    lVar5 = lVar5 + 400;
  } while (lVar9 != 0x32);
  lVar5 = 0x16a418;
  lVar11 = 0x16f238;
  lVar9 = 0x174058;
  lVar7 = 1;
  do {
    dVar13 = vy[lVar7][0];
    lVar10 = 0;
    do {
      dVar14 = (*(double *)(lVar11 + -400 + lVar10 * 8) - *(double *)(lVar11 + lVar10 * 8)) + dVar13
      ;
      dVar13 = *(double *)(lVar9 + lVar10 * 8);
      *(double *)(lVar5 + lVar10 * 8) = (dVar14 - dVar13) * dVar12 + *(double *)(lVar5 + lVar10 * 8)
      ;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0x31);
    lVar7 = lVar7 + 1;
    lVar5 = lVar5 + 400;
    lVar11 = lVar11 + 400;
    lVar9 = lVar9 + 400;
  } while (lVar7 != 0x32);
  return;
}

Assistant:

void calc_grid(void)
{
    int x, y, x2, y2;
    double time_step = dt * ANIMATION_SPEED;

    // Compute accelerations
    for (x = 0;  x < GRIDW;  x++)
    {
        x2 = (x + 1) % GRIDW;
        for(y = 0; y < GRIDH; y++)
            ax[x][y] = p[x][y] - p[x2][y];
    }

    for (y = 0;  y < GRIDH;  y++)
    {
        y2 = (y + 1) % GRIDH;
        for(x = 0; x < GRIDW; x++)
            ay[x][y] = p[x][y] - p[x][y2];
    }

    // Compute speeds
    for (x = 0;  x < GRIDW;  x++)
    {
        for (y = 0;  y < GRIDH;  y++)
        {
            vx[x][y] = vx[x][y] + ax[x][y] * time_step;
            vy[x][y] = vy[x][y] + ay[x][y] * time_step;
        }
    }

    // Compute pressure
    for (x = 1;  x < GRIDW;  x++)
    {
        x2 = x - 1;
        for (y = 1;  y < GRIDH;  y++)
        {
            y2 = y - 1;
            p[x][y] = p[x][y] + (vx[x2][y] - vx[x][y] + vy[x][y2] - vy[x][y]) * time_step;
        }
    }
}